

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtLookupToken(SelectionCompiler *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long in_RDI;
  bool bVar4;
  char ch;
  int ichT;
  int local_14;
  bool local_1;
  
  if (*(int *)(in_RDI + 0xd8) == *(int *)(in_RDI + 0xd0)) {
    local_1 = false;
  }
  else {
    iVar2 = *(int *)(in_RDI + 0xd8);
    local_14 = iVar2 + 1;
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    cVar1 = *pcVar3;
    switch(cVar1) {
    case '!':
    case '/':
      if ((local_14 < *(int *)(in_RDI + 0xd0)) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20), *pcVar3 == '=')) {
        local_14 = iVar2 + 2;
      }
      break;
    default:
      if (((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < 'A' && (('Z' < cVar1 && (cVar1 != '_'))))))
      {
        return false;
      }
    case '*':
    case '?':
      while( true ) {
        bVar4 = false;
        if (local_14 < *(int *)(in_RDI + 0xd0)) {
          pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
          cVar1 = *pcVar3;
          iVar2 = isspace((int)cVar1);
          bVar4 = false;
          if (iVar2 == 0) {
            iVar2 = isalpha((int)cVar1);
            bVar4 = true;
            if (iVar2 == 0) {
              iVar2 = isdigit((int)cVar1);
              bVar4 = true;
              if (((((iVar2 == 0) && (bVar4 = true, cVar1 != '_')) && (bVar4 = true, cVar1 != '.'))
                  && ((bVar4 = true, cVar1 != '*' && (bVar4 = true, cVar1 != '?')))) &&
                 ((bVar4 = true, cVar1 != '+' &&
                  ((bVar4 = true, cVar1 != '-' && (bVar4 = true, cVar1 != '[')))))) {
                bVar4 = cVar1 == ']';
              }
            }
          }
        }
        if (!bVar4) break;
        local_14 = local_14 + 1;
      }
      break;
    case '&':
    case '|':
      if ((local_14 < *(int *)(in_RDI + 0xd0)) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20), *pcVar3 == cVar1)) {
        local_14 = iVar2 + 2;
      }
      break;
    case '(':
    case ')':
    case ',':
    case '[':
    case ']':
      break;
    case '<':
    case '=':
    case '>':
      if (local_14 < *(int *)(in_RDI + 0xd0)) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
        cVar1 = *pcVar3;
        if (((cVar1 == '<') || (cVar1 == '=')) || (cVar1 == '>')) {
          local_14 = iVar2 + 2;
        }
      }
    }
    *(int *)(in_RDI + 0xdc) = local_14 - *(int *)(in_RDI + 0xd8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::lookingAtLookupToken() {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    char ch;
    switch (ch = script[ichT++]) {
    case '(':
    case ')':
    case ',':
    case '[':
    case ']':
      break;
    case '&':
    case '|':
      if (ichT < cchScript && script[ichT] == ch) { ++ichT; }
      break;
    case '<':
    case '=':
    case '>':
      if (ichT < cchScript &&
          ((ch = script[ichT]) == '<' || ch == '=' || ch == '>')) {
        ++ichT;
      }
      break;
    case '/':
    case '!':
      if (ichT < cchScript && script[ichT] == '=') { ++ichT; }
      break;
    default:
      if ((ch < 'a' || ch > 'z') && (ch < 'A' && ch > 'Z') && ch != '_') {
        return false;
      }
      [[fallthrough]];
    case '*':
    case '?':  // include question marks in identifier for atom expressions
      while (ichT < cchScript && !std::isspace(ch = script[ichT]) &&
             (std::isalpha(ch) || std::isdigit(ch) || ch == '_' || ch == '.' ||
              ch == '*' || ch == '?' || ch == '+' || ch == '-' || ch == '[' ||
              ch == ']')) {
        ++ichT;
      }
      break;
    }

    cchToken = ichT - ichToken;

    return true;
  }